

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckId(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *pNVar4;
  uint uVar5;
  ctmbstr s;
  char *pcVar6;
  
  if ((attval == (AttVal *)0x0) || (pcVar6 = attval->value, pcVar6 == (char *)0x0)) {
    uVar5 = 0xfe;
    goto LAB_00126570;
  }
  pLVar2 = doc->lexer;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\0') goto LAB_0012651e;
    pcVar6 = pcVar6 + 1;
    BVar3 = prvTidyIsHTMLSpace((int)cVar1);
  } while (BVar3 == no);
  if (pLVar2->isvoyager == no) {
LAB_0012650b:
    uVar5 = 0xff;
  }
  else {
    BVar3 = prvTidyIsValidXMLID(attval->value);
    uVar5 = 0x112;
    if (BVar3 == no) goto LAB_0012650b;
  }
  prvTidyReportAttrError(doc,node,attval,uVar5);
LAB_0012651e:
  pNVar4 = GetNodeByAnchor(doc,attval->value);
  if (pNVar4 == node || pNVar4 == (Node *)0x0) {
    AddAnchor(doc,attval->value,node);
    return;
  }
  uVar5 = 0x10e;
LAB_00126570:
  prvTidyReportAttrError(doc,node,attval,uVar5);
  return;
}

Assistant:

void CheckId( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    Lexer* lexer = doc->lexer;
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if (!TY_(IsValidHTMLID)(attval->value))
    {
        if (lexer->isvoyager && TY_(IsValidXMLID)(attval->value))
            TY_(ReportAttrError)( doc, node, attval, XML_ID_SYNTAX);
        else
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }

    if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
    {
        TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
    }
    else
        AddAnchor( doc, attval->value, node );
}